

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_diag_sse41_128_64.c
# Opt level: O2

parasail_result_t *
parasail_sw_stats_table_diag_sse41_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  ulong uVar1;
  long lVar2;
  int64_t iVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  ulong uVar8;
  uint uVar9;
  parasail_result_t *ppVar10;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  int64_t *ptr_03;
  int64_t *ptr_04;
  int64_t *ptr_05;
  int64_t *ptr_06;
  int64_t *ptr_07;
  int64_t *ptr_08;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  int64_t *piVar16;
  char *pcVar17;
  int64_t *piVar18;
  longlong extraout_RDX;
  int64_t *piVar19;
  ulong uVar20;
  int32_t i;
  int iVar21;
  char *__format;
  ulong uVar22;
  long lVar23;
  int iVar24;
  int64_t *piVar25;
  int iVar26;
  int iVar27;
  int64_t *piVar28;
  int iVar29;
  int64_t *piVar30;
  uint extraout_XMM0_Da;
  uint extraout_XMM0_Da_00;
  undefined8 extraout_XMM0_Qa;
  long lVar31;
  ulong extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  uint extraout_XMM0_Dc;
  undefined1 auVar32 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ulong extraout_XMM0_Qb_00;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  uint extraout_XMM0_Dc_00;
  undefined8 extraout_XMM0_Qb_01;
  uint extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  undefined1 extraout_XMM0_01 [16];
  undefined8 extraout_XMM0_Qb_02;
  undefined1 extraout_XMM0_02 [16];
  long lVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  __m128i alVar51;
  undefined1 auVar52 [16];
  __m128i_64_t B_4;
  undefined1 auVar53 [16];
  long lVar54;
  __m128i_64_t B;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  __m128i_64_t B_2;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  long lVar61;
  __m128i_64_t B_3;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  __m128i alVar66;
  long lVar67;
  undefined1 auVar68 [16];
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i alVar75;
  __m128i alVar76;
  __m128i vWH;
  __m128i vWH_00;
  __m128i vWH_01;
  __m128i vWH_02;
  int32_t s2Len_00;
  undefined1 local_3c8 [16];
  long lStack_3c0;
  undefined1 local_388 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined8 local_338;
  undefined8 uStack_330;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  ulong uStack_290;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  long local_258;
  long lStack_250;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_1f8 [16];
  __m128i local_1e8;
  __m128i local_1d8;
  __m128i local_1c8;
  __m128i local_1b8;
  __m128i local_1a8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  __m128i vMaxH;
  undefined8 uStack_100;
  ulong uStack_f0;
  ulong uStack_d0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar17 = "_s2";
LAB_00681f50:
    fprintf(_stderr,__format,"parasail_sw_stats_table_diag_sse41_128_64",pcVar17);
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar17 = "s2Len";
    goto LAB_00681f50;
  }
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar17 = "open";
    goto LAB_00681f50;
  }
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar17 = "gap";
    goto LAB_00681f50;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar17 = "matrix";
    goto LAB_00681f50;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
              "parasail_sw_stats_table_diag_sse41_128_64");
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar17 = "_s1";
      goto LAB_00681f50;
    }
    uVar20 = (ulong)(uint)_s1Len;
    if (_s1Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar17 = "_s1Len";
      goto LAB_00681f50;
    }
    if (matrix->type == 0) goto LAB_00680d30;
  }
  uVar20 = (ulong)(uint)matrix->length;
LAB_00680d30:
  iVar26 = matrix->min;
  uVar11 = 0x8000000000000000 - (long)iVar26;
  if (iVar26 != -open && SBORROW4(iVar26,-open) == iVar26 + open < 0) {
    uVar11 = (ulong)(uint)open | 0x8000000000000000;
  }
  piVar18 = (int64_t *)(uVar11 + 1);
  iVar26 = matrix->max;
  alVar76[1]._0_4_ = (int)piVar18;
  alVar76[0] = (longlong)piVar18;
  alVar76[1]._4_4_ = (int)((ulong)piVar18 >> 0x20);
  iVar21 = (int)uVar20;
  local_1e8 = alVar76;
  local_1d8 = alVar76;
  local_1c8 = alVar76;
  local_1b8 = alVar76;
  local_1a8 = alVar76;
  vMaxH = alVar76;
  ppVar10 = parasail_result_new_table3(iVar21,s2Len);
  if (ppVar10 != (parasail_result_t *)0x0) {
    ppVar10->flag = ppVar10->flag | 0x2831004;
    ptr = parasail_memalign_int64_t(0x10,(long)(iVar21 + 1));
    uVar11 = (ulong)(s2Len + 2);
    ptr_00 = parasail_memalign_int64_t(0x10,uVar11);
    ptr_01 = parasail_memalign_int64_t(0x10,uVar11);
    ptr_02 = parasail_memalign_int64_t(0x10,uVar11);
    ptr_03 = parasail_memalign_int64_t(0x10,uVar11);
    ptr_04 = parasail_memalign_int64_t(0x10,uVar11);
    ptr_05 = parasail_memalign_int64_t(0x10,uVar11);
    ptr_06 = parasail_memalign_int64_t(0x10,uVar11);
    ptr_07 = parasail_memalign_int64_t(0x10,uVar11);
    ptr_08 = parasail_memalign_int64_t(0x10,uVar11);
    auVar32._0_8_ = -(ulong)(ptr == (int64_t *)0x0);
    auVar32._8_8_ = -(ulong)(ptr_00 == (int64_t *)0x0);
    auVar49._0_8_ = -(ulong)(ptr_01 == (int64_t *)0x0);
    auVar49._8_8_ = -(ulong)(ptr_02 == (int64_t *)0x0);
    auVar32 = packssdw(auVar32,auVar49);
    auVar53._0_8_ = -(ulong)(ptr_03 == (int64_t *)0x0);
    auVar53._8_8_ = -(ulong)(ptr_04 == (int64_t *)0x0);
    auVar45._0_8_ = -(ulong)(ptr_05 == (int64_t *)0x0);
    auVar45._8_8_ = -(ulong)(ptr_06 == (int64_t *)0x0);
    auVar49 = packssdw(auVar53,auVar45);
    auVar32 = packssdw(auVar32,auVar49);
    uVar11 = 0;
    if ((ptr_08 != (int64_t *)0x0 && ptr_07 != (int64_t *)0x0) &&
        ((((((((((((((((auVar32 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar32 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar32 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar32 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar32 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar32 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar32 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar32 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar32 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar32 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar32 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar32 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar32 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar32 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar32[0xf]))
    {
      uVar8 = (ulong)(uint)s2Len;
      local_198._0_8_ = 0x7ffffffffffffffe - (long)iVar26;
      auVar56._8_4_ = (int)local_198._0_8_;
      auVar56._0_8_ = local_198._0_8_;
      auVar56._12_4_ = (int)((ulong)local_198._0_8_ >> 0x20);
      uStack_290 = alVar76[1];
      lVar23 = (long)iVar21;
      uVar14 = 0;
      if (0 < iVar21) {
        uVar14 = uVar20;
      }
      for (; lVar15 = lVar23, uVar14 != uVar11; uVar11 = uVar11 + 1) {
        ptr[uVar11] = (long)matrix->mapper[(byte)_s1[uVar11]];
      }
      for (; lVar15 <= lVar23; lVar15 = lVar15 + 1) {
        ptr[lVar15] = 0;
      }
      a[0] = matrix->mapper;
      for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
        ptr_00[uVar11 + 1] = (long)a[0][(byte)_s2[uVar11]];
      }
      *ptr_00 = 0;
      for (uVar11 = uVar8; (int)uVar11 <= s2Len; uVar11 = uVar11 + 1) {
        ptr_00[uVar11 + 1] = 0;
      }
      for (lVar15 = 0; uVar8 * 8 - lVar15 != 0; lVar15 = lVar15 + 8) {
        *(undefined8 *)((long)ptr_01 + lVar15 + 8) = 0;
        *(undefined8 *)((long)ptr_02 + lVar15 + 8) = 0;
        *(undefined8 *)((long)ptr_03 + lVar15 + 8) = 0;
        *(undefined8 *)((long)ptr_04 + lVar15 + 8) = 0;
        *(int64_t **)((long)ptr_05 + lVar15 + 8) = piVar18;
        *(undefined8 *)((long)ptr_06 + lVar15 + 8) = 0;
        *(undefined8 *)((long)ptr_07 + lVar15 + 8) = 0;
        *(undefined8 *)((long)ptr_08 + lVar15 + 8) = 0;
      }
      *ptr_02 = 0;
      *ptr_03 = 0;
      *ptr_04 = 0;
      *ptr_05 = (int64_t)piVar18;
      *ptr_06 = 0;
      *ptr_07 = 0;
      *ptr_08 = 0;
      piVar16 = ptr_07 + uVar8 + 1;
      vWH_02[0] = ptr_05 + uVar8 + 1;
      for (lVar15 = 0; s2Len + (int)lVar15 <= s2Len; lVar15 = lVar15 + 1) {
        ptr_01[uVar8 + lVar15 + 1] = (int64_t)piVar18;
        ptr_02[uVar8 + lVar15 + 1] = 0;
        ptr_03[uVar8 + lVar15 + 1] = 0;
        ptr_04[uVar8 + lVar15 + 1] = 0;
        vWH_02[0][lVar15] = (int64_t)piVar18;
        ptr_06[uVar8 + lVar15 + 1] = 0;
        piVar16[lVar15] = 0;
        ptr_08[uVar8 + lVar15 + 1] = 0;
      }
      *ptr_01 = 0;
      local_1f8._0_12_ = ZEXT812(1);
      local_1f8._12_4_ = 0;
      local_148._8_8_ = uStack_290;
      local_148._0_8_ = piVar18;
      local_158._8_8_ = uStack_290;
      local_158._0_8_ = piVar18;
      local_168._8_8_ = uStack_290;
      local_168._0_8_ = piVar18;
      local_178._8_8_ = uStack_290;
      local_178._0_8_ = piVar18;
      uStack_100 = auVar56._8_8_;
      local_198._8_8_ = uStack_100;
      local_188._8_8_ = uStack_290;
      local_188._0_8_ = piVar18;
      for (uVar11 = 0; (long)uVar11 < lVar23; uVar11 = uVar11 + 2) {
        uVar14 = ptr[uVar11];
        uVar1 = ptr[uVar11 + 1];
        vWH_02[0] = (int64_t *)matrix->matrix;
        uVar9 = (uint)uVar11 | 1;
        if (lVar23 <= (long)(uVar11 | 1)) {
          uVar9 = iVar21 - 1;
        }
        a[0] = (int *)(long)matrix->size;
        uVar12 = (ulong)(int)uVar9;
        uVar22 = uVar11;
        if (matrix->type == 0) {
          uVar12 = uVar1;
          uVar22 = uVar14;
        }
        piVar28 = (int64_t *)((long)vWH_02[0] + uVar22 * (long)a[0] * 4);
        lVar15 = (long)vWH_02[0] + uVar12 * (long)a[0] * 4;
        alVar75[1] = (longlong)piVar28;
        alVar75[0] = uVar1;
        a[1] = (longlong)vWH_02[0];
        piVar16 = piVar28;
        uVar22 = uVar11;
        alVar75 = _mm_cmplt_epi64_rpl(a,alVar75);
        local_358 = ZEXT816(0);
        uVar12 = 0;
        auVar57._8_8_ = 0;
        auVar57._0_8_ = uStack_290;
        auVar49 = (undefined1  [16])0x0;
        auVar53 = (undefined1  [16])0x0;
        auVar32 = (undefined1  [16])0x0;
        local_368._8_8_ = uStack_290;
        local_368._0_8_ = piVar18;
        local_238._0_8_ = 0;
        local_238._8_8_ = 0;
        local_248._0_8_ = 0;
        local_248._8_8_ = 0;
        local_258 = 0;
        lStack_250 = 0;
        local_228._8_8_ = uStack_290;
        local_228._0_8_ = piVar18;
        local_2b8 = ZEXT816(0);
        local_2c8 = pmovsxbq(local_2b8,0xff);
        uStack_d0 = uStack_290;
        auVar58 = auVar57;
        uVar69 = 0;
        uVar70 = 0;
        uVar71 = 0;
        uVar72 = 0;
        uVar73 = 0;
        uVar74 = 0;
        uStack_330._0_4_ = 0;
        uStack_330._4_4_ = 0;
        lVar67 = 0;
        lVar54 = 0;
        local_2a8 = local_2b8;
        for (; alVar51[0] = alVar75[1], uVar12 <= uVar8; uVar12 = uVar12 + 1) {
          lVar31 = auVar57._8_8_;
          lVar2 = ptr_01[uVar12 + 1];
          local_a8 = auVar49._8_4_;
          uStack_a4 = auVar49._12_4_;
          uStack_a0 = (undefined4)ptr_02[uVar12 + 1];
          uStack_9c = (undefined4)((ulong)ptr_02[uVar12 + 1] >> 0x20);
          local_b8 = auVar53._8_4_;
          uStack_b4 = auVar53._12_4_;
          uStack_b0 = (undefined4)ptr_03[uVar12 + 1];
          uStack_ac = (undefined4)((ulong)ptr_03[uVar12 + 1] >> 0x20);
          lVar44 = auVar32._8_8_;
          iVar3 = ptr_04[uVar12 + 1];
          lVar61 = ptr_05[uVar12 + 1];
          local_358._0_8_ = local_358._8_8_;
          local_358._8_8_ = ptr_06[uVar12 + 1];
          local_2a8._0_8_ = local_2a8._8_8_;
          local_2a8._8_8_ = ptr_07[uVar12 + 1];
          local_2b8._0_8_ = local_2b8._8_8_;
          local_2b8._8_8_ = ptr_08[uVar12 + 1];
          local_3c8._0_8_ = lVar2 - (ulong)(uint)open;
          uStack_280 = (undefined4)local_3c8._0_8_;
          uStack_27c = (undefined4)((ulong)local_3c8._0_8_ >> 0x20);
          uStack_f0 = (ulong)(uint)gap;
          local_228._0_8_ = local_228._8_8_ - (ulong)(uint)gap;
          local_228._8_8_ = lVar61 - uStack_f0;
          local_388._8_8_ = lStack_250;
          local_388._0_8_ = local_258;
          local_338 = CONCAT44(uVar74,uVar73);
          alVar51[1] = (longlong)piVar16;
          a_00[1] = (longlong)vWH_02[0];
          a_00[0] = (longlong)a[0];
          alVar75 = _mm_cmpgt_epi64_rpl(a_00,alVar51);
          alVar66[0] = alVar75[1];
          auVar65._8_4_ = uStack_a0;
          auVar65._0_8_ = auVar49._8_8_;
          auVar65._12_4_ = uStack_9c;
          local_358 = pblendvb(local_358,auVar65,extraout_XMM0);
          auVar62._8_4_ = uStack_b0;
          auVar62._0_8_ = auVar53._8_8_;
          auVar62._12_4_ = uStack_ac;
          local_2a8 = pblendvb(local_2a8,auVar62,extraout_XMM0);
          auVar59._8_8_ = iVar3;
          auVar59._0_8_ = lVar44;
          auVar45 = pblendvb(local_2b8,auVar59,extraout_XMM0);
          auVar68._8_4_ = 0xffffffff;
          auVar68._0_8_ = 0xffffffffffffffff;
          auVar68._12_4_ = 0xffffffff;
          local_2b8._0_8_ = auVar45._0_8_ + 1;
          local_2b8._8_8_ = auVar45._8_8_ - auVar68._8_8_;
          local_3c8._0_8_ = auVar57._0_8_;
          local_3c8._0_8_ = local_3c8._0_8_ - (ulong)(uint)open;
          lStack_3c0 = lVar31 - (ulong)(uint)open;
          local_368._0_8_ = local_368._0_8_ - (ulong)(uint)gap;
          local_368._8_8_ = local_368._8_8_ - uStack_f0;
          alVar66[1] = (longlong)piVar16;
          a_01[1] = (longlong)vWH_02[0];
          a_01[0] = (longlong)a[0];
          _mm_cmpgt_epi64_rpl(a_01,alVar66);
          auVar62 = pblendvb(local_238,auVar49,extraout_XMM0_00);
          auVar59 = pblendvb(local_248,auVar53,extraout_XMM0_00);
          auVar53 = pblendvb(local_388,auVar32,extraout_XMM0_00);
          uVar4 = ptr_00[uVar12 + 1];
          b[1] = (long)*(int *)((long)piVar28 + uVar4 * 4);
          local_258 = auVar58._0_8_;
          lStack_250 = auVar58._8_8_;
          auVar55._0_8_ = local_258 + *(int *)(lVar15 + ptr_00[uVar12] * 4);
          auVar55._8_8_ = lStack_250 + b[1];
          auVar60._8_4_ = uStack_280;
          auVar60._0_8_ = lVar31 - (ulong)(uint)open;
          auVar60._12_4_ = uStack_27c;
          auVar33._0_8_ = -(ulong)((long)local_228._0_8_ < (long)(lVar31 - (ulong)(uint)open));
          auVar33._8_8_ = -(ulong)((long)(lVar61 - uStack_f0) < auVar60._8_8_);
          local_228 = blendvpd(local_228,auVar60,auVar33);
          auVar34._0_8_ = -(ulong)((long)local_368._0_8_ < local_3c8._0_8_);
          auVar34._8_8_ = -(ulong)((long)local_368._8_8_ < (long)(lVar31 - (ulong)(uint)open));
          auVar45 = blendvpd(local_368,local_3c8,auVar34);
          auVar35._0_8_ = -(ulong)(auVar45._0_8_ < auVar55._0_8_);
          auVar35._8_8_ = -(ulong)(auVar45._8_8_ < auVar55._8_8_);
          auVar32 = blendvpd(auVar45,auVar55,auVar35);
          lVar61 = local_228._0_8_;
          auVar36._0_8_ = -(ulong)(lVar61 < auVar32._0_8_);
          auVar36._8_8_ = -(ulong)(local_228._8_8_ < auVar32._8_8_);
          auVar49 = blendvpd(local_228,auVar32,auVar36);
          auVar37._0_8_ = -(ulong)(0 < auVar49._0_8_);
          auVar37._8_8_ = -(ulong)(0 < auVar49._8_8_);
          auVar37 = auVar37 & auVar49;
          auVar63._0_8_ = -(ulong)(auVar55._0_8_ == auVar37._0_8_);
          auVar63._8_8_ = -(ulong)(auVar55._8_8_ == auVar37._8_8_);
          auVar38._0_8_ = -(ulong)(auVar37._0_8_ == lVar61);
          auVar38._8_8_ = -(ulong)(auVar37._8_8_ == local_228._8_8_);
          auVar56 = blendvpd(auVar62,local_358,auVar38);
          auVar32 = pmovsxbq(auVar38,0x101);
          local_348._8_8_ = -(ulong)(auVar49._8_8_ < auVar32._8_8_);
          local_348._0_8_ = -(ulong)(auVar49._0_8_ < auVar32._0_8_);
          auVar46._0_8_ = local_338 + (ulong)(uVar1 == uStack_d0);
          auVar46._8_8_ = uStack_330 + (ulong)(uVar14 == uVar4);
          auVar49 = blendvpd(auVar56,auVar46,auVar63);
          auVar32 = blendvpd(auVar59,local_2a8,auVar38);
          local_388._0_8_ = auVar53._0_8_;
          local_388._8_8_ = auVar53._8_8_;
          local_388._8_8_ = local_388._8_8_ + 1;
          local_388._0_8_ = local_388._0_8_ + 1;
          b[0] = lVar15;
          a_02[1] = (longlong)vWH_02[0];
          a_02[0] = (longlong)a[0];
          _mm_cmpgt_epi64_rpl(a_02,b);
          auVar47._0_8_ = (extraout_XMM0_Qa_00 & 1) + CONCAT44(uVar70,uVar69);
          auVar47._8_8_ = (extraout_XMM0_Qb_00 & 1) + CONCAT44(uVar72,uVar71);
          auVar53 = blendvpd(auVar32,auVar47,auVar63);
          auVar32 = blendvpd(local_388,local_2b8,auVar38);
          auVar52._8_4_ = 0xffffffff;
          auVar52._0_8_ = 0xffffffffffffffff;
          auVar52._12_4_ = 0xffffffff;
          auVar50._0_8_ = lVar67 + 1;
          auVar50._8_8_ = lVar54 - auVar52._8_8_;
          auVar32 = blendvpd(auVar32,auVar50,auVar63);
          auVar64._0_8_ = -(ulong)(local_2c8._0_8_ == -1);
          auVar64._8_8_ = -(ulong)(local_2c8._8_8_ == auVar52._8_8_);
          auVar57 = ~auVar64 & auVar37;
          local_348 = local_348 | auVar64;
          auVar49 = ~local_348 & auVar49;
          auVar53 = ~local_348 & auVar53;
          auVar32 = ~local_348 & auVar32;
          local_368 = blendvpd(auVar45,(undefined1  [16])alVar76,auVar64);
          piVar16 = auVar32._0_8_;
          lVar54 = auVar57._0_8_;
          lVar67 = auVar57._8_8_;
          if (1 < uVar12) {
            auVar39._0_8_ = -(ulong)(local_198._0_8_ < lVar54);
            auVar39._8_8_ = -(ulong)(local_198._8_8_ < lVar67);
            local_198 = blendvpd(auVar57,local_198,auVar39);
            auVar40._0_8_ = -(ulong)(lVar54 < local_188._0_8_);
            auVar40._8_8_ = -(ulong)(lVar67 < local_188._8_8_);
            auVar45 = blendvpd(auVar57,local_188,auVar40);
            auVar41._0_8_ = -(ulong)(auVar49._0_8_ < auVar45._0_8_);
            auVar41._8_8_ = -(ulong)(auVar49._8_8_ < auVar45._8_8_);
            auVar45 = blendvpd(auVar49,auVar45,auVar41);
            auVar42._0_8_ = -(ulong)(auVar53._0_8_ < auVar45._0_8_);
            auVar42._8_8_ = -(ulong)(auVar53._8_8_ < auVar45._8_8_);
            auVar45 = blendvpd(auVar53,auVar45,auVar42);
            auVar43._0_8_ = -(ulong)((long)piVar16 < auVar45._0_8_);
            auVar43._8_8_ = -(ulong)(auVar32._8_8_ < auVar45._8_8_);
            local_188 = blendvpd(auVar32,auVar45,auVar43);
          }
          auVar65 = ~auVar64 & local_388;
          vWH[0] = uVar11 & 0xffffffff;
          i = (int32_t)uVar12;
          s2Len_00 = auVar57._0_4_;
          vWH[1] = uVar20;
          arr_store_si128(*((ppVar10->field_4).trace)->trace_del_table,vWH,i,s2Len,(int32_t)uVar22,
                          s2Len_00);
          vWH_00[0] = uVar11 & 0xffffffff;
          vWH_00[1] = uVar20;
          arr_store_si128(*(int **)((long)((ppVar10->field_4).trace)->trace_del_table + 8),vWH_00,i,
                          s2Len,(int32_t)uVar22,s2Len_00);
          vWH_01[0] = uVar11 & 0xffffffff;
          vWH_01[1] = uVar20;
          arr_store_si128(*(int **)((long)((ppVar10->field_4).trace)->trace_del_table + 0x10),vWH_01
                          ,i,s2Len,(int32_t)uVar22,s2Len_00);
          a[0] = *(int **)((long)((ppVar10->field_4).trace)->trace_del_table + 0x18);
          vWH_02[0] = (int64_t *)(uVar11 & 0xffffffff);
          vWH_02[1] = uVar20;
          arr_store_si128(a[0],vWH_02,i,s2Len,(int32_t)uVar22,s2Len_00);
          ptr_01[uVar12] = lVar54;
          ptr_02[uVar12] = auVar49._0_8_;
          ptr_03[uVar12] = auVar53._0_8_;
          ptr_04[uVar12] = (int64_t)piVar16;
          ptr_05[uVar12] = lVar61;
          ptr_06[uVar12] = local_358._0_8_;
          ptr_07[uVar12] = local_2a8._0_8_;
          ptr_08[uVar12] = local_2b8._0_8_;
          b_00[1] = (longlong)piVar16;
          b_00[0] = extraout_RDX;
          a_03[1] = (longlong)vWH_02[0];
          a_03[0] = (longlong)a[0];
          alVar75 = _mm_cmpgt_epi64_rpl(a_03,b_00);
          b_01[0] = alVar75[1];
          b_01[1] = (longlong)piVar16;
          a_04[1] = (longlong)vWH_02[0];
          a_04[0] = (longlong)a[0];
          alVar75 = _mm_cmplt_epi64_rpl(a_04,b_01);
          alVar66 = vMaxH;
          b_02[0] = alVar75[1];
          local_68 = (uint)extraout_XMM0_Qa;
          uStack_64 = (uint)((ulong)extraout_XMM0_Qa >> 0x20);
          uStack_60 = (uint)extraout_XMM0_Qb;
          uStack_5c = (uint)((ulong)extraout_XMM0_Qb >> 0x20);
          local_388._0_4_ = (undefined4)extraout_XMM0_Qa_01;
          local_388._4_4_ = (undefined4)((ulong)extraout_XMM0_Qa_01 >> 0x20);
          local_388._8_4_ = (undefined4)extraout_XMM0_Qb_01;
          local_388._12_4_ = (undefined4)((ulong)extraout_XMM0_Qb_01 >> 0x20);
          local_388._0_4_ = extraout_XMM0_Da & local_68 & local_388._0_4_;
          local_388._4_4_ = extraout_XMM0_Db & uStack_64 & local_388._4_4_;
          local_388._8_4_ = extraout_XMM0_Dc & uStack_60 & local_388._8_4_;
          local_388._12_4_ = extraout_XMM0_Dd & uStack_5c & local_388._12_4_;
          bVar5 = lVar54 == vMaxH[0];
          bVar6 = lVar67 == vMaxH[1];
          b_02[1] = (longlong)piVar16;
          a_05[1] = (longlong)vWH_02[0];
          a_05[0] = (longlong)a[0];
          alVar75 = _mm_cmpgt_epi64_rpl(a_05,b_02);
          alVar51 = local_1e8;
          b_03[0] = alVar75[1];
          b_03[1] = (longlong)piVar16;
          a_06[1] = (longlong)vWH_02[0];
          a_06[0] = (longlong)a[0];
          alVar75 = _mm_cmplt_epi64_rpl(a_06,b_03);
          auVar7._4_4_ = extraout_XMM0_Db_00 & local_388._4_4_;
          auVar7._0_4_ = extraout_XMM0_Da_00 & local_388._0_4_;
          auVar7._8_4_ = extraout_XMM0_Dc_00 & local_388._8_4_;
          auVar7._12_4_ = extraout_XMM0_Dd_00 & local_388._12_4_;
          alVar66 = (__m128i)pblendvb((undefined1  [16])alVar66,auVar57,auVar7);
          auVar60 = pblendvb(local_178,auVar49,auVar7);
          auVar58 = pblendvb(local_168,auVar53,auVar7);
          auVar56 = pblendvb(local_158,auVar32,auVar7);
          auVar45 = pblendvb(local_148,local_1f8,auVar7);
          auVar68 = pblendvb((undefined1  [16])alVar51,local_2c8,auVar7);
          auVar48._8_8_ = -(ulong)bVar6;
          auVar48._0_8_ = -(ulong)bVar5;
          auVar48 = extraout_XMM0_01 & local_388 & auVar48;
          local_178 = pblendvb(auVar60,auVar49,auVar48);
          local_168 = pblendvb(auVar58,auVar53,auVar48);
          vMaxH[0] = alVar66[0];
          vMaxH[1] = alVar66[1];
          local_158 = pblendvb(auVar56,auVar32,auVar48);
          local_148 = pblendvb(auVar45,local_1f8,auVar48);
          alVar51 = (__m128i)pblendvb(auVar68,local_2c8,auVar48);
          local_1e8[0] = alVar51[0];
          local_1e8[1] = alVar51[1];
          local_2c8._8_8_ = local_2c8._8_8_ + 1;
          local_2c8._0_8_ = local_2c8._0_8_ + 1;
          auVar58._8_8_ = lVar2;
          auVar58._0_8_ = lVar31;
          local_238._0_8_ = SUB168(~auVar64 & auVar62,0);
          local_238._8_8_ = SUB168(~auVar64 & auVar62,8);
          local_248._0_8_ = SUB168(~auVar64 & auVar59,0);
          local_248._8_8_ = SUB168(~auVar64 & auVar59,8);
          local_258 = auVar65._0_8_;
          lStack_250 = auVar65._8_8_;
          uVar69 = local_b8;
          uVar70 = uStack_b4;
          uVar71 = uStack_b0;
          uVar72 = uStack_ac;
          uVar73 = local_a8;
          uVar74 = uStack_a4;
          uStack_330._0_4_ = uStack_a0;
          uStack_330._4_4_ = uStack_9c;
          lVar67 = lVar44;
          lVar54 = iVar3;
          uStack_d0 = uVar4;
        }
        local_1f8._8_8_ = local_1f8._8_8_ + 2;
        local_1f8._0_8_ = local_1f8._0_8_ + 2;
      }
      local_1a8[0] = local_178._0_8_;
      local_1a8[1] = local_178._8_8_;
      local_1b8[0] = local_168._0_8_;
      local_1b8[1] = local_168._8_8_;
      local_1c8[0] = local_158._0_8_;
      local_1c8[1] = local_158._8_8_;
      local_1d8[0] = local_148._0_8_;
      local_1d8[1] = local_148._8_8_;
      lVar15 = 0;
      iVar26 = 0;
      iVar21 = 0;
      piVar19 = ptr;
      piVar25 = piVar18;
      piVar28 = piVar18;
      piVar30 = piVar18;
      do {
        iVar24 = (int)piVar25;
        iVar29 = (int)piVar30;
        iVar27 = (int)piVar28;
        if ((int)lVar15 == 2) {
          b_04[1] = (longlong)piVar16;
          b_04[0] = (longlong)piVar19;
          a_07[1] = (longlong)vWH_02[0];
          a_07[0] = lVar23;
          alVar76 = _mm_cmplt_epi64_rpl(a_07,b_04);
          b_05[0] = alVar76[1];
          lStack_3c0 = extraout_XMM0_Qb_02;
          local_3c8._0_8_ = extraout_XMM0_Qa_02;
          b_05[1] = (longlong)piVar16;
          a_08[1] = (longlong)vWH_02[0];
          a_08[0] = lVar23;
          _mm_cmpgt_epi64_rpl(a_08,b_05);
          iVar13 = (int)piVar18;
          local_3c8 = extraout_XMM0_02 | local_3c8;
          if ((((((((((((((((local_3c8 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (local_3c8 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (local_3c8 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (local_3c8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (local_3c8 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (local_3c8 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (local_3c8 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (local_3c8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (local_3c8 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (local_3c8 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (local_3c8 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (local_3c8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (local_3c8 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (local_3c8 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (local_3c8 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              local_3c8[0xf] < '\0') {
            *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
            iVar26 = 0;
            iVar21 = 0;
            iVar13 = 0;
            iVar27 = 0;
            iVar29 = 0;
            iVar24 = 0;
          }
          ppVar10->score = iVar13;
          ppVar10->end_query = iVar26;
          ppVar10->end_ref = iVar21;
          ((ppVar10->field_4).stats)->matches = iVar27;
          ((ppVar10->field_4).stats)->similar = iVar29;
          ((ppVar10->field_4).stats)->length = iVar24;
          parasail_free(ptr_08);
          parasail_free(ptr_07);
          parasail_free(ptr_06);
          parasail_free(ptr_05);
          parasail_free(ptr_04);
          parasail_free(ptr_03);
          parasail_free(ptr_02);
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          return ppVar10;
        }
        piVar16 = (int64_t *)vMaxH[lVar15];
        if ((long)piVar18 < (long)piVar16) {
          piVar28 = (int64_t *)local_1a8[lVar15];
          piVar30 = (int64_t *)local_1b8[lVar15];
          piVar25 = (int64_t *)local_1c8[lVar15];
          iVar26 = (int)local_1d8[lVar15];
          iVar21 = (int)local_1e8[lVar15];
          piVar18 = piVar16;
        }
        else if (piVar16 == piVar18) {
          piVar16 = (int64_t *)local_1e8[lVar15];
          piVar19 = (int64_t *)(long)iVar21;
          if ((long)piVar16 < (long)piVar19) {
            piVar28 = (int64_t *)local_1a8[lVar15];
            piVar30 = (int64_t *)local_1b8[lVar15];
            piVar25 = (int64_t *)local_1c8[lVar15];
            iVar26 = (int)local_1d8[lVar15];
LAB_00681d31:
            iVar21 = (int)piVar16;
          }
          else if (piVar16 == piVar19) {
            piVar19 = (int64_t *)local_1d8[lVar15];
            vWH_02[0] = (int64_t *)(long)iVar26;
            if ((long)piVar19 < (long)vWH_02[0]) {
              piVar28 = (int64_t *)local_1a8[lVar15];
              piVar30 = (int64_t *)local_1b8[lVar15];
              piVar25 = (int64_t *)local_1c8[lVar15];
              iVar26 = (int)piVar19;
              goto LAB_00681d31;
            }
          }
        }
        lVar15 = lVar15 + 1;
        piVar16 = piVar18;
      } while( true );
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i case0 = vZero;
        __m128i vNH = vNegInf0;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vNegInf0;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi64x_rpl(
                s1[i+0],
                s1[i+1]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vNM = _mm_srli_si128(vWM, 8);
            vNM = _mm_insert_epi64_rpl(vNM, HM_pr[j], 1);
            vNS = _mm_srli_si128(vWS, 8);
            vNS = _mm_insert_epi64_rpl(vNS, HS_pr[j], 1);
            vNL = _mm_srli_si128(vWL, 8);
            vNL = _mm_insert_epi64_rpl(vNL, HL_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vFM = _mm_srli_si128(vFM, 8);
            vFM = _mm_insert_epi64_rpl(vFM, FM_pr[j], 1);
            vFS = _mm_srli_si128(vFS, 8);
            vFS = _mm_insert_epi64_rpl(vFS, FS_pr[j], 1);
            vFL = _mm_srli_si128(vFL, 8);
            vFL = _mm_insert_epi64_rpl(vFL, FL_pr[j], 1);
            vF_opn = _mm_sub_epi64(vNH, vOpen);
            vF_ext = _mm_sub_epi64(vF, vGap);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vE_opn = _mm_sub_epi64(vWH, vOpen);
            vE_ext = _mm_sub_epi64(vE, vGap);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 8);
            vs2 = _mm_insert_epi64_rpl(vs2, s2[j], 1);
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            vWH = _mm_max_epi64_rpl(vWH, vZero);
            case1 = _mm_cmpeq_epi64(vWH, vNWH);
            case2 = _mm_cmpeq_epi64(vWH, vF);
            case0 = _mm_cmpeq_epi64(vWH, vZero);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi64(vs1,vs2),
                            vOne)),
                    case1);
            vWM = _mm_blendv_epi8(vWM, vZero, case0);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi64_rpl(vMat,vZero),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(vWS, vZero, case0);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vNWL, vOne), case1);
            vWL = _mm_blendv_epi8(vWL, vZero, case0);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            HM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWM,0);
            HS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWS,0);
            HL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWL,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            FM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFM,0);
            FS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFS,0);
            FL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi64_rpl(vJ, vNegOne),
                        _mm_cmplt_epi64_rpl(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi64(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi64_rpl(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *m = (int64_t*)&vMaxM;
        int64_t *s = (int64_t*)&vMaxS;
        int64_t *l = (int64_t*)&vMaxL;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++m, ++s, ++l, ++i, ++j) {
            if (*t > score) {
                score = *t;
                matches = *m;
                similar = *s;
                length = *l;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}